

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall dxil_spv::CFGNode::can_backtrace_to(CFGNode *this,CFGNode *parent)

{
  bool bVar1;
  UnorderedSet<const_CFGNode_*> node_cache;
  _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_48;
  
  if (parent->forward_post_visit_order < this->forward_post_visit_order) {
    bVar1 = false;
  }
  else {
    local_48._M_buckets = &local_48._M_single_bucket;
    local_48._M_bucket_count = 1;
    local_48._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_48._M_element_count = 0;
    local_48._M_rehash_policy._M_max_load_factor = 1.0;
    local_48._M_rehash_policy._M_next_resize = 0;
    local_48._M_single_bucket = (__node_base_ptr)0x0;
    bVar1 = can_backtrace_to(this,parent,(UnorderedSet<const_CFGNode_*> *)&local_48);
    std::
    _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_48);
  }
  return bVar1;
}

Assistant:

bool CFGNode::can_backtrace_to(const CFGNode *parent) const
{
	// If parent can branch to this, then post_order(parent) must be greater than post_order(this).
	if (parent->forward_post_visit_order < forward_post_visit_order)
		return false;

	UnorderedSet<const CFGNode *> node_cache;
	return can_backtrace_to(parent, node_cache);
}